

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# except.cc
# Opt level: O0

void kratos::print_ast_node(IRNode *node)

{
  bool bVar1;
  ostream *poVar2;
  istream *piVar3;
  string local_2b8 [32];
  istream local_298 [8];
  ifstream file;
  string local_90 [8];
  string line;
  uint32_t line_count;
  string local_60 [32];
  uint *local_40;
  type *line_number;
  type *filename;
  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  local_28;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *__range2;
  IRNode *node_local;
  
  if (node != (IRNode *)0x0) {
    std::mutex::lock((mutex *)print_ast_mutex_);
    bVar1 = std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            ::empty(&node->fn_name_ln);
    if (!bVar1) {
      __end2 = std::
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::begin(&node->fn_name_ln);
      local_28._M_current =
           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
            *)std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
              ::end(&node->fn_name_ln);
      while (bVar1 = __gnu_cxx::operator!=(&__end2,&local_28), bVar1) {
        filename = &__gnu_cxx::
                    __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                    ::operator*(&__end2)->first;
        line_number = (type *)std::get<0ul,std::__cxx11::string,unsigned_int>
                                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                                          *)filename);
        local_40 = std::get<1ul,std::__cxx11::string,unsigned_int>
                             ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                               *)filename);
        bVar1 = fs::exists((string *)line_number);
        if (bVar1) {
          blue_line_abi_cxx11_();
          poVar2 = std::operator<<((ostream *)&std::cerr,local_60);
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string(local_60);
          poVar2 = std::operator<<((ostream *)&std::cerr,"\x1b[94m");
          poVar2 = std::operator<<(poVar2,(string *)line_number);
          poVar2 = std::operator<<(poVar2,":");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,*local_40);
          poVar2 = std::operator<<(poVar2,"\x1b[0m");
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          line.field_2._8_4_ = 0;
          std::__cxx11::string::string(local_90);
          std::ifstream::ifstream(local_298,(string *)line_number,_S_in);
          while( true ) {
            piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                               (local_298,local_90);
            bVar1 = std::ios::operator_cast_to_bool
                              ((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
            if (!bVar1) break;
            line.field_2._8_4_ = line.field_2._8_4_ + 1;
            if (line.field_2._8_4_ == *local_40) {
              poVar2 = std::operator<<((ostream *)&std::cerr,"\x1b[91m");
              poVar2 = std::operator<<(poVar2,">");
              poVar2 = std::operator<<(poVar2,local_90);
              poVar2 = std::operator<<(poVar2,"\x1b[0m");
              std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
            }
            else if ((*local_40 - 2 <= (uint)line.field_2._8_4_) &&
                    ((uint)line.field_2._8_4_ <= *local_40 + 2)) {
              poVar2 = std::operator<<((ostream *)&std::cerr,"\x1b[92m");
              poVar2 = std::operator<<(poVar2," ");
              poVar2 = std::operator<<(poVar2,local_90);
              poVar2 = std::operator<<(poVar2,"\x1b[0m");
              std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
            }
          }
          blue_line_abi_cxx11_();
          poVar2 = std::operator<<((ostream *)&std::cerr,local_2b8);
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string(local_2b8);
          std::ifstream::~ifstream(local_298);
          std::__cxx11::string::~string(local_90);
        }
        __gnu_cxx::
        __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
        ::operator++(&__end2);
      }
    }
    std::mutex::unlock((mutex *)print_ast_mutex_);
  }
  return;
}

Assistant:

void print_ast_node(const IRNode* node) {
    if (!node) {
        return;
    }
    print_ast_mutex_.lock();
    if (!node->fn_name_ln.empty()) {
        // print out a blue line
        for (auto const& [filename, line_number] : node->fn_name_ln) {
            if (fs::exists(filename)) {
                std::cerr << blue_line() << std::endl;
                std::cerr << BLUE << filename << ":" << line_number << ENDC << std::endl;
                uint32_t line_count = 0;
                std::string line;
                std::ifstream file(filename);
                while (std::getline(file, line)) {
                    line_count++;
                    if (line_count == line_number) {
                        std::cerr << RED << ">" << line << ENDC << std::endl;
                    } else if (line_count >= line_number - CODE_RANGE &&
                               line_count <= line_number + CODE_RANGE) {
                        std::cerr << GREEN << " " << line << ENDC << std::endl;
                    }
                }
                std::cerr << blue_line() << std::endl;
            }
        }
    }
    print_ast_mutex_.unlock();
}